

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

bool SearchHelper(ON_RTreeNode *a_node,ON_Line *a_line,ON_RTreeSearchResultCallback *a_result)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  lVar2 = (long)a_node->m_count;
  if (lVar2 < 1) {
    bVar4 = true;
  }
  else if (a_node->m_level < 1) {
    for (lVar3 = 0; bVar4 = lVar2 * 0x38 - lVar3 == 0, !bVar4; lVar3 = lVar3 + 0x38) {
      bVar1 = OverlapLineHelper(a_line,(ON_RTreeBBox *)
                                       ((long)a_node->m_branch[0].m_rect.m_min + lVar3));
      if ((bVar1) &&
         (bVar1 = (*a_result->m_resultCallback)
                            (a_result->m_context,
                             *(ON__INT_PTR *)((long)(&a_node->m_branch[0].m_rect + 1) + lVar3)),
         !bVar1)) {
        return bVar4;
      }
    }
  }
  else {
    for (lVar3 = 0; bVar4 = lVar2 * 0x38 - lVar3 == 0, !bVar4; lVar3 = lVar3 + 0x38) {
      bVar1 = OverlapLineHelper(a_line,(ON_RTreeBBox *)
                                       ((long)a_node->m_branch[0].m_rect.m_min + lVar3));
      if ((bVar1) &&
         (bVar1 = SearchHelper(*(ON_RTreeNode **)((long)(&a_node->m_branch[0].m_rect + 1) + lVar3),
                               a_line,a_result), !bVar1)) {
        return bVar4;
      }
    }
  }
  return bVar4;
}

Assistant:

static
bool SearchHelper(const ON_RTreeNode* a_node, const ON_Line* a_line, ON_RTreeSearchResultCallback& a_result)
{
  // NOTE: 
   //  Some versions of ON_RTree::Search shrink a_rect as the search progresses.
  int i, count;

  if ((count = a_node->m_count) > 0)
  {
    const ON_RTreeBranch* branch = a_node->m_branch;
    if (a_node->IsInternalNode())
    {
      // a_node is an internal node - search m_branch[].m_child as needed
      for (i = 0; i < count; ++i)
      {
        if (OverlapLineHelper(a_line, &branch[i].m_rect))
        {
          if (!SearchHelper(branch[i].m_child, a_line, a_result))
          {
            return false; // Don't continue searching
          }
        }
      }
    }
    else
    {
      // a_node is a leaf node - return m_branch[].m_id values
      for (i = 0; i < count; ++i)
      {
        if (OverlapLineHelper(a_line, &branch[i].m_rect))
        {
          if (!a_result.m_resultCallback(a_result.m_context, branch[i].m_id))
          {
            // callback canceled search
            return false;
          }
        }
      }
    }
  }

  return true; // Continue searching
}